

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Performance::lightVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLights,bool isVertexCase,
          LightType lightType)

{
  undefined3 in_register_00000009;
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ulong uVar2;
  string ndxStr;
  byte local_29c;
  uint local_298;
  int local_294;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = CONCAT31(in_register_00000009,isVertexCase);
  local_298 = (uint)this;
  uVar2 = (ulong)this & 0xffffffff;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (local_190._M_dataplus._M_p._0_4_ = 0; (int)local_190._M_dataplus._M_p < (int)uVar2;
      local_190._M_dataplus._M_p._0_4_ = (int)local_190._M_dataplus._M_p + 1) {
    de::toString<int>(&local_170,(int *)&local_190);
    std::operator+(&local_290,"uniform mediump vec3 u_light",&local_170);
    std::operator+(&local_1f0,&local_290,"_color${NAME_SPEC};\nuniform mediump vec3 u_light");
    std::operator+(&local_250,&local_1f0,&local_170);
    std::operator+(&local_1b0,&local_250,"_direction${NAME_SPEC};\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_290);
    if (iVar1 == 1) {
      std::operator+(&local_1d0,"uniform mediump vec4 u_light",&local_170);
      std::operator+(&local_230,&local_1d0,"_position${NAME_SPEC};\nuniform mediump float u_light");
      std::operator+(&local_210,&local_230,&local_170);
      std::operator+(&local_270,&local_210,
                     "_constantAttenuation${NAME_SPEC};\nuniform mediump float u_light");
      std::operator+(&local_290,&local_270,&local_170);
      std::operator+(&local_1f0,&local_290,
                     "_linearAttenuation${NAME_SPEC};\nuniform mediump float u_light");
      std::operator+(&local_250,&local_1f0,&local_170);
      std::operator+(&local_1b0,&local_250,"_quadraticAttenuation${NAME_SPEC};\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    std::__cxx11::string::~string((string *)&local_170);
    uVar2 = (ulong)local_298;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_29c = (byte)numLights;
  if (local_29c == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (iVar1 == 1) {
      de::toString<int>(&local_290,(int *)&local_298);
      std::operator+(&local_1f0,"out mediump vec3 v_directionToLight${NAME_SPEC}[",&local_290);
      std::operator+(&local_250,&local_1f0,"];\nout mediump float v_distanceToLight${NAME_SPEC}[");
      de::toString<int>(&local_270,(int *)&local_298);
      std::operator+(&local_1b0,&local_250,&local_270);
      std::operator+(&local_170,&local_1b0,"];\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_290);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (iVar1 == 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_29c == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_294 = 0;
  do {
    if ((int)local_298 <= local_294) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    de::toString<int>(&local_170,&local_294);
    std::operator+(&local_250,"\t/* Light ",&local_170);
    std::operator+(&local_1b0,&local_250," */\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_250);
    if (iVar1 == 1) {
      std::operator+(&local_1d0,"\tmediump float distanceToLight",&local_170);
      std::operator+(&local_230,&local_1d0," = distance(eyePosition, u_light");
      std::operator+(&local_210,&local_230,&local_170);
      std::operator+(&local_270,&local_210,
                     "_position${NAME_SPEC});\n\tmediump vec3 directionToLight");
      std::operator+(&local_290,&local_270,&local_170);
      std::operator+(&local_1f0,&local_290," = normalize(direction(eyePosition, u_light");
      std::operator+(&local_250,&local_1f0,&local_170);
      std::operator+(&local_1b0,&local_250,"_position${NAME_SPEC}));\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1d0);
      if (local_29c == 0) {
        std::operator+(&local_1d0,"\tv_directionToLight${NAME_SPEC}[",&local_170);
        std::operator+(&local_230,&local_1d0,"] = directionToLight");
        std::operator+(&local_210,&local_230,&local_170);
        std::operator+(&local_270,&local_210,";\n\tv_distanceToLight${NAME_SPEC}[");
        std::operator+(&local_290,&local_270,&local_170);
        std::operator+(&local_1f0,&local_290,"]  = distanceToLight");
        std::operator+(&local_250,&local_1f0,&local_170);
        std::operator+(&local_1b0,&local_250,";\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        this_00 = &local_1d0;
      }
      else {
        std::operator+(&local_b0,"\tmediump vec3 halfVector",&local_170);
        std::operator+(&local_90,&local_b0," = normalize(directionToLight");
        std::operator+(&local_70,&local_90,&local_170);
        std::operator+(&local_50,&local_70,
                       " + vec3(0.0, 0.0, 1.0));\n\tcolor.rgb += computeLighting(directionToLight");
        std::operator+(&local_150,&local_50,&local_170);
        std::operator+(&local_130,&local_150,", halfVector");
        std::operator+(&local_110,&local_130,&local_170);
        std::operator+(&local_f0,&local_110,", eyeNormal, u_light");
        std::operator+(&local_d0,&local_f0,&local_170);
        std::operator+(&local_190,&local_d0,
                       "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight"
                      );
        std::operator+(&local_1d0,&local_190,&local_170);
        std::operator+(&local_230,&local_1d0,", u_light");
        std::operator+(&local_210,&local_230,&local_170);
        std::operator+(&local_270,&local_210,"_constantAttenuation${NAME_SPEC}, u_light");
        std::operator+(&local_290,&local_270,&local_170);
        std::operator+(&local_1f0,&local_290,"_linearAttenuation${NAME_SPEC}, u_light");
        std::operator+(&local_250,&local_1f0,&local_170);
        std::operator+(&local_1b0,&local_250,"_quadraticAttenuation${NAME_SPEC});\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_b0;
      }
LAB_006bd93b:
      std::__cxx11::string::~string((string *)this_00);
    }
    else if ((iVar1 == 0 & local_29c) != 0) {
      std::operator+(&local_150,"\tmediump vec3 directionToLight",&local_170);
      std::operator+(&local_130,&local_150," = -u_light");
      std::operator+(&local_110,&local_130,&local_170);
      std::operator+(&local_f0,&local_110,"_direction${NAME_SPEC};\n\tmediump vec3 halfVector");
      std::operator+(&local_d0,&local_f0,&local_170);
      std::operator+(&local_190,&local_d0," = normalize(directionToLight");
      std::operator+(&local_1d0,&local_190,&local_170);
      std::operator+(&local_230,&local_1d0,
                     " + vec3(0.0, 0.0, 1.0));\n\tcolor.rgb += computeLighting(directionToLight");
      std::operator+(&local_210,&local_230,&local_170);
      std::operator+(&local_270,&local_210,", halfVector");
      std::operator+(&local_290,&local_270,&local_170);
      std::operator+(&local_1f0,&local_290,", eyeNormal, u_light");
      std::operator+(&local_250,&local_1f0,&local_170);
      std::operator+(&local_1b0,&local_250,
                     "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n"
                    );
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      this_00 = &local_150;
      goto LAB_006bd93b;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_170);
    local_294 = local_294 + 1;
  } while( true );
}

Assistant:

static string lightVertexTemplate (int numLights, bool isVertexCase, LightType lightType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"in highp vec4 a_position${NAME_SPEC};\n"
		"in mediump vec3 a_normal${NAME_SPEC};\n"
		"in mediump vec4 a_texCoord0${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_ambientColor${NAME_SPEC};\n"
		"uniform mediump vec4 u_material_diffuseColor${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_emissiveColor${NAME_SPEC};\n"
		"uniform mediump vec3 u_material_specularColor${NAME_SPEC};\n"
		"uniform mediump float u_material_shininess${NAME_SPEC};\n";

	for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
	{
		string ndxStr = de::toString(lightNdx);

		resultTemplate +=
			"uniform mediump vec3 u_light" + ndxStr + "_color${NAME_SPEC};\n"
			"uniform mediump vec3 u_light" + ndxStr + "_direction${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"uniform mediump vec4 u_light" + ndxStr + "_position${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_constantAttenuation${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_linearAttenuation${NAME_SPEC};\n"
				"uniform mediump float u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC};\n";
	}

	resultTemplate +=
		"uniform highp mat4 u_mvpMatrix${NAME_SPEC};\n"
		"uniform highp mat4 u_modelViewMatrix${NAME_SPEC};\n"
		"uniform mediump mat3 u_normalMatrix${NAME_SPEC};\n"
		"uniform mediump mat4 u_texCoordMatrix0${NAME_SPEC};\n"
		"out mediump vec4 v_color${NAME_SPEC};\n"
		"out mediump vec2 v_texCoord0${NAME_SPEC};\n";

	if (!isVertexCase)
	{
		resultTemplate += "out mediump vec3 v_eyeNormal${NAME_SPEC};\n";

		if (lightType == LIGHT_POINT)
			resultTemplate +=
				"out mediump vec3 v_directionToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n"
				"out mediump float v_distanceToLight${NAME_SPEC}[" + de::toString(numLights) + "];\n";
	}

	resultTemplate +=
		"mediump vec3 direction (mediump vec4 from, mediump vec4 to)\n"
		"{\n"
		"	return vec3(to.xyz * from.w - from.xyz * to.w);\n"
		"}\n"
		"\n"
		"mediump vec3 computeLighting (\n"
		"	mediump vec3 directionToLight,\n"
		"	mediump vec3 halfVector,\n"
		"	mediump vec3 normal,\n"
		"	mediump vec3 lightColor,\n"
		"	mediump vec3 diffuseColor,\n"
		"	mediump vec3 specularColor,\n"
		"	mediump float shininess)\n"
		"{\n"
		"	mediump float normalDotDirection  = max(dot(normal, directionToLight), 0.0);\n"
		"	mediump vec3  color               = normalDotDirection * diffuseColor * lightColor;\n"
		"\n"
		"	if (normalDotDirection != 0.0)\n"
		"		color += pow(max(dot(normal, halfVector), 0.0), shininess) * specularColor * lightColor;\n"
		"\n"
		"	return color;\n"
		"}\n"
		"\n";

	if (lightType == LIGHT_POINT)
		resultTemplate +=
			"mediump float computeDistanceAttenuation (mediump float distToLight, mediump float constAtt, mediump float linearAtt, mediump float quadraticAtt)\n"
			"{\n"
			"	return 1.0 / (constAtt + linearAtt * distToLight + quadraticAtt * distToLight * distToLight);\n"
			"}\n"
			"\n";

	resultTemplate +=
		"void main (void)\n"
		"{\n"
		"	highp vec4 position = a_position${NAME_SPEC};\n"
		"	highp vec3 normal = a_normal${NAME_SPEC};\n"
		"	gl_Position = u_mvpMatrix${NAME_SPEC} * position * (0.95 + 0.05*${FLOAT01});\n"
		"	v_texCoord0${NAME_SPEC} = (u_texCoordMatrix0${NAME_SPEC} * a_texCoord0${NAME_SPEC}).xy;\n"
		"	mediump vec4 color = vec4(u_material_emissiveColor${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.a);\n"
		"\n"
		"	highp vec4 eyePosition = u_modelViewMatrix${NAME_SPEC} * position;\n"
		"	mediump vec3 eyeNormal = normalize(u_normalMatrix${NAME_SPEC} * normal);\n";

	if (!isVertexCase)
		resultTemplate += "\tv_eyeNormal${NAME_SPEC} = eyeNormal;\n";

	resultTemplate += "\n";

	for (int lightNdx = 0; lightNdx < numLights; lightNdx++)
	{
		string ndxStr = de::toString(lightNdx);

		resultTemplate +=
			"	/* Light " + ndxStr + " */\n";

		if (lightType == LIGHT_POINT)
		{
			resultTemplate +=
				"	mediump float distanceToLight" + ndxStr + " = distance(eyePosition, u_light" + ndxStr + "_position${NAME_SPEC});\n"
				"	mediump vec3 directionToLight" + ndxStr + " = normalize(direction(eyePosition, u_light" + ndxStr + "_position${NAME_SPEC}));\n";

			if (isVertexCase)
				resultTemplate +=
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, "
					"u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC}) * computeDistanceAttenuation(distanceToLight" + ndxStr + ", u_light" + ndxStr + "_constantAttenuation${NAME_SPEC}, "
					"u_light" + ndxStr + "_linearAttenuation${NAME_SPEC}, u_light" + ndxStr + "_quadraticAttenuation${NAME_SPEC});\n";
			else
				resultTemplate +=
					"	v_directionToLight${NAME_SPEC}[" + ndxStr + "] = directionToLight" + ndxStr + ";\n"
					"	v_distanceToLight${NAME_SPEC}[" + ndxStr + "]  = distanceToLight" + ndxStr + ";\n";
		}
		else if (lightType == LIGHT_DIRECTIONAL)
		{
			if (isVertexCase)
				resultTemplate +=
					"	mediump vec3 directionToLight" + ndxStr + " = -u_light" + ndxStr + "_direction${NAME_SPEC};\n"
					"	mediump vec3 halfVector" + ndxStr + " = normalize(directionToLight" + ndxStr + " + vec3(0.0, 0.0, 1.0));\n"
					"	color.rgb += computeLighting(directionToLight" + ndxStr + ", halfVector" + ndxStr + ", eyeNormal, u_light" + ndxStr + "_color${NAME_SPEC}, u_material_diffuseColor${NAME_SPEC}.rgb, u_material_specularColor${NAME_SPEC}, u_material_shininess${NAME_SPEC});\n";
		}
		else
			DE_ASSERT(DE_FALSE);

		resultTemplate += "\n";
	}

	resultTemplate +=
		"	v_color${NAME_SPEC} = color;\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}